

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

SizeT __thiscall Qentem::Value<char>::Length(Value<char> *this)

{
  ValueType VVar1;
  ValueType type;
  Value<char> *this_local;
  
  VVar1 = Type(this);
  if (VVar1 == String) {
    this_local._4_4_ = String<char>::Length((String<char> *)this);
  }
  else if (VVar1 == ValuePtr) {
    this_local._4_4_ = Length((this->field_0).array_.storage_);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

SizeT Length() const noexcept {
        const ValueType type = Type();

        if (type == ValueType::String) {
            return (string_.Length());
        }

        if (type == ValueType::ValuePtr) {
            return (value_->Length());
        }

        return 0;
    }